

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_flush(int handle)

{
  int iVar1;
  int in_EDI;
  int local_4;
  
  iVar1 = fflush((FILE *)handleTable[in_EDI].fileptr);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = 0x6a;
  }
  return local_4;
}

Assistant:

int file_flush(int handle)
/*
  flush the file
*/
{
    if (fflush(handleTable[handle].fileptr) )
        return(WRITE_ERROR);

    /* The flush operation is not supposed to move the internal */
    /* file pointer, but it does on some Windows-95 compilers and */
    /* perhaps others, so seek to original position to be sure. */
    /* This seek will do no harm on other systems.   */

#if MACHINE == IBMPC

    if (file_seek(handle, handleTable[handle].currentpos))
            return(SEEK_ERROR);

#endif

    return(0);
}